

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleBuilder.h
# Opt level: O3

void __thiscall
Refal2::CNamedQualifierInfo::CNamedQualifierInfo(CNamedQualifierInfo *this,CToken *nameToken)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  TNumber TVar4;
  
  iVar2 = nameToken->line;
  iVar3 = nameToken->position;
  TVar4 = nameToken->number;
  (this->NameToken).type = nameToken->type;
  (this->NameToken).line = iVar2;
  (this->NameToken).position = iVar3;
  (this->NameToken).number = TVar4;
  (this->NameToken).word._M_dataplus._M_p = (pointer)&(this->NameToken).word.field_2;
  pcVar1 = (nameToken->word)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->NameToken).word,pcVar1,pcVar1 + (nameToken->word)._M_string_length);
  CQualifier::CQualifier(&this->qualifier);
  return;
}

Assistant:

CNamedQualifierInfo( const CToken& nameToken ): NameToken( nameToken ) {}